

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallDirectoryGenerator::~cmInstallDirectoryGenerator(cmInstallDirectoryGenerator *this)

{
  ~cmInstallDirectoryGenerator(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

cmInstallDirectoryGenerator::~cmInstallDirectoryGenerator() = default;